

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

void MOJOSHADER_freePreshader(MOJOSHADER_preshader *preshader)

{
  void *d;
  uint uVar1;
  code *UNRECOVERED_JUMPTABLE;
  ulong uVar2;
  long lVar3;
  long lVar4;
  MOJOSHADER_preshaderInstruction *pMVar5;
  ulong uVar6;
  
  if (preshader != (MOJOSHADER_preshader *)0x0) {
    d = preshader->malloc_data;
    UNRECOVERED_JUMPTABLE = preshader->free;
    if (UNRECOVERED_JUMPTABLE == (MOJOSHADER_free)0x0) {
      UNRECOVERED_JUMPTABLE = MOJOSHADER_internal_free;
    }
    (*UNRECOVERED_JUMPTABLE)(preshader->literals,d);
    uVar1 = preshader->instruction_count;
    pMVar5 = preshader->instructions;
    if (uVar1 != 0) {
      lVar3 = 0x20;
      uVar2 = 0;
      do {
        if (pMVar5[uVar2].operand_count != 0) {
          uVar6 = 0;
          lVar4 = lVar3;
          do {
            (*UNRECOVERED_JUMPTABLE)(*(void **)((long)pMVar5->operands + lVar4 + -0x10),d);
            uVar6 = uVar6 + 1;
            pMVar5 = preshader->instructions;
            lVar4 = lVar4 + 0x18;
          } while (uVar6 < pMVar5[uVar2].operand_count);
          uVar1 = preshader->instruction_count;
        }
        uVar2 = uVar2 + 1;
        lVar3 = lVar3 + 0x70;
      } while (uVar2 < uVar1);
    }
    (*UNRECOVERED_JUMPTABLE)(pMVar5,d);
    (*UNRECOVERED_JUMPTABLE)(preshader->registers,d);
    free_symbols(UNRECOVERED_JUMPTABLE,d,preshader->symbols,preshader->symbol_count);
    (*UNRECOVERED_JUMPTABLE)(preshader,d);
    return;
  }
  return;
}

Assistant:

void MOJOSHADER_freePreshader(const MOJOSHADER_preshader *preshader)
{
    if (preshader != NULL)
    {
        unsigned int i, j;
        void *d = preshader->malloc_data;
        MOJOSHADER_free f = preshader->free;
        if (f == NULL) f = MOJOSHADER_internal_free;

        f((void *) preshader->literals, d);
        for (i = 0; i < preshader->instruction_count; i++)
        {
            for (j = 0; j < preshader->instructions[i].operand_count; j++)
                f((void *) preshader->instructions[i].operands[j].array_registers, d);
        } // for
        f((void *) preshader->instructions, d);
        f((void *) preshader->registers, d);
        free_symbols(f, d, preshader->symbols, preshader->symbol_count);
        f((void *) preshader, d);
    } // if
}